

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

int SUNLinSolSolve_PCG(SUNLinearSolver S,SUNMatrix nul,N_Vector x,N_Vector b,sunrealtype delta)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  code *pcVar9;
  code *pcVar10;
  long lVar11;
  double dVar12;
  bool bVar13;
  int iVar14;
  int *piVar15;
  int *piVar16;
  undefined4 uVar17;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  bool bVar18;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int status;
  int *nli;
  sunrealtype *res_norm;
  SUNPSolveFn psolve;
  SUNATimesFn atimes;
  void *P_data;
  void *A_data;
  int pretype;
  int l_max;
  int l;
  int *zeroguess;
  int converged;
  int UseScaling;
  int UsePrec;
  N_Vector w;
  N_Vector Ap;
  N_Vector z;
  N_Vector p;
  N_Vector r;
  sunrealtype rz_old;
  sunrealtype rz;
  sunrealtype rho;
  sunrealtype r0_norm;
  sunrealtype beta;
  sunrealtype alpha;
  SUNContext_conflict sunctx_local_scope_;
  double local_100;
  double local_f8;
  int local_ac;
  double local_60;
  double local_58;
  int local_4;
  
  iVar1 = *(int *)*in_RDI;
  uVar2 = *(undefined8 *)(*in_RDI + 0x50);
  uVar3 = *(undefined8 *)(*in_RDI + 0x58);
  uVar4 = *(undefined8 *)(*in_RDI + 0x60);
  uVar5 = *(undefined8 *)(*in_RDI + 0x68);
  lVar6 = *(long *)(*in_RDI + 0x48);
  uVar7 = *(undefined8 *)(*in_RDI + 0x28);
  uVar8 = *(undefined8 *)(*in_RDI + 0x40);
  pcVar9 = *(code **)(*in_RDI + 0x20);
  pcVar10 = *(code **)(*in_RDI + 0x38);
  iVar14 = *(int *)(*in_RDI + 4);
  piVar15 = (int *)(*in_RDI + 8);
  piVar16 = (int *)(*in_RDI + 0xc);
  lVar11 = *in_RDI;
  *piVar16 = 0;
  bVar13 = false;
  bVar18 = true;
  if ((iVar14 != 3) && (bVar18 = true, iVar14 != 1)) {
    bVar18 = iVar14 == 2;
  }
  if (*piVar15 == 0) {
    iVar14 = (*pcVar9)(uVar7,in_RDX,uVar2);
    if (iVar14 != 0) {
      *piVar15 = 0;
      uVar17 = 0x323;
      if (iVar14 < 0) {
        uVar17 = 0xfffffcdb;
      }
      *(undefined4 *)(*in_RDI + 0x18) = uVar17;
      return *(int *)(*in_RDI + 0x18);
    }
    N_VLinearSum(0,0xbff0000000000000,in_RCX,uVar2,uVar2);
  }
  else {
    N_VScale(0,in_RCX,uVar2);
  }
  if (lVar6 == 0) {
    N_VScale(0,uVar2,uVar5);
  }
  else {
    N_VProd(uVar2,lVar6,uVar5);
  }
  dVar12 = (double)N_VDotProd(uVar5,uVar5);
  if (0.0 < dVar12) {
    local_f8 = sqrt(dVar12);
  }
  else {
    local_f8 = 0.0;
  }
  local_58 = local_f8;
  *(double *)(lVar11 + 0x10) = local_f8;
  if ((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) < local_f8) {
    if (bVar18) {
      iVar14 = (*pcVar10)(in_XMM0_Da,uVar8,uVar2,uVar4,1);
      if (iVar14 != 0) {
        *piVar15 = 0;
        uVar17 = 0x325;
        if (iVar14 < 0) {
          uVar17 = 0xfffffcd8;
        }
        *(undefined4 *)(*in_RDI + 0x18) = uVar17;
        return *(int *)(*in_RDI + 0x18);
      }
    }
    else {
      N_VScale(0,uVar2,uVar4);
    }
    local_60 = (double)N_VDotProd(uVar2,uVar4);
    N_VScale(0,uVar4,uVar3);
    for (local_ac = 0; local_ac < iVar1; local_ac = local_ac + 1) {
      *piVar16 = *piVar16 + 1;
      iVar14 = (*pcVar9)(uVar7,uVar3,uVar5);
      if (iVar14 != 0) {
        *piVar15 = 0;
        uVar17 = 0x323;
        if (iVar14 < 0) {
          uVar17 = 0xfffffcdb;
        }
        *(undefined4 *)(*in_RDI + 0x18) = uVar17;
        return *(int *)(*in_RDI + 0x18);
      }
      dVar12 = (double)N_VDotProd(uVar5,uVar3);
      dVar12 = local_60 / dVar12;
      if ((local_ac == 0) && (*piVar15 != 0)) {
        N_VScale(SUB84(dVar12,0),uVar3,in_RDX);
      }
      else {
        N_VLinearSum(0,dVar12,in_RDX,uVar3,in_RDX);
      }
      N_VLinearSum(0,-dVar12,uVar2,uVar5,uVar2);
      if (lVar6 == 0) {
        N_VScale(0,uVar2,uVar5);
      }
      else {
        N_VProd(uVar2,lVar6,uVar5);
      }
      dVar12 = (double)N_VDotProd(uVar5,uVar5);
      if (0.0 < dVar12) {
        local_100 = sqrt(dVar12);
      }
      else {
        local_100 = 0.0;
      }
      local_58 = local_100;
      *(double *)(lVar11 + 0x10) = local_100;
      if (local_100 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
        bVar13 = true;
        break;
      }
      if (local_ac == iVar1 + -1) break;
      if (bVar18) {
        iVar14 = (*pcVar10)(in_XMM0_Da,uVar8,uVar2,uVar4,1);
        if (iVar14 != 0) {
          *piVar15 = 0;
          uVar17 = 0x325;
          if (iVar14 < 0) {
            uVar17 = 0xfffffcd8;
          }
          *(undefined4 *)(*in_RDI + 0x18) = uVar17;
          return *(int *)(*in_RDI + 0x18);
        }
      }
      else {
        N_VScale(0,uVar2,uVar4);
      }
      dVar12 = (double)N_VDotProd(uVar2,uVar4);
      N_VLinearSum(0,dVar12 / local_60,uVar4,uVar3,uVar3);
      local_60 = dVar12;
    }
    *piVar15 = 0;
    if (bVar13) {
      *(undefined4 *)(*in_RDI + 0x18) = 0;
    }
    else if (local_f8 <= local_58) {
      *(undefined4 *)(*in_RDI + 0x18) = 0x322;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x18) = 0x321;
    }
    local_4 = *(int *)(*in_RDI + 0x18);
  }
  else {
    *piVar15 = 0;
    *(undefined4 *)(*in_RDI + 0x18) = 0;
    local_4 = *(int *)(*in_RDI + 0x18);
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_PCG(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix nul,
                       N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, beta, r0_norm, rho, rz, rz_old;
  N_Vector r, p, z, Ap, w;
  sunbooleantype UsePrec, UseScaling, converged;
  sunbooleantype* zeroguess;
  int l, l_max, pretype;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  int status;

  /* Make local shorcuts to solver variables. */
  l_max     = PCG_CONTENT(S)->maxl;
  r         = PCG_CONTENT(S)->r;
  p         = PCG_CONTENT(S)->p;
  z         = PCG_CONTENT(S)->z;
  Ap        = PCG_CONTENT(S)->Ap;
  w         = PCG_CONTENT(S)->s;
  A_data    = PCG_CONTENT(S)->ATData;
  P_data    = PCG_CONTENT(S)->PData;
  atimes    = PCG_CONTENT(S)->ATimes;
  psolve    = PCG_CONTENT(S)->Psolve;
  pretype   = PCG_CONTENT(S)->pretype;
  zeroguess = &(PCG_CONTENT(S)->zeroguess);
  nli       = &(PCG_CONTENT(S)->numiters);
  res_norm  = &(PCG_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  UsePrec    = ((pretype == SUN_PREC_BOTH) || (pretype == SUN_PREC_LEFT) ||
             (pretype == SUN_PREC_RIGHT));
  UseScaling = (w != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!UsePrec || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r to initial residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, r);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r, r);
    SUNCheckLastErr();
  }

  /* Set rho to scaled L2 norm of r, and return if small */
  if (UseScaling)
  {
    N_VProd(r, w, Ap);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r, Ap);
    SUNCheckLastErr();
  }
  rho = N_VDotProd(Ap, Ap);
  SUNCheckLastErr();
  *res_norm = r0_norm = rho = SUNRsqrt(rho);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO, "SUNLinSolSolve_PCG",
                     "initial-residual", "nli = %li, resnorm = %.16g",
                     (long int)0, *res_norm);
#endif

  if (rho <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Apply preconditioner and b-scaling to r = r_0 */
  if (UsePrec)
  {
    status = psolve(P_data, r, z, delta, SUN_PREC_LEFT); /* z = P^{-1}r */
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r, z);
    SUNCheckLastErr();
  }

  /* Initialize rz to <r,z> */
  rz = N_VDotProd(r, z);
  SUNCheckLastErr();

  /* Copy z to p */
  N_VScale(ONE, z, p);
  SUNCheckLastErr();

  /* Begin main iteration loop */
  for (l = 0; l < l_max; l++)
  {
    /* increment counter */
    (*nli)++;

    /* Generate Ap = A*p */
    status = atimes(A_data, p, Ap);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    /* Calculate alpha = <r,z> / <Ap,p> */
    alpha = N_VDotProd(Ap, p);
    SUNCheckLastErr();
    alpha = rz / alpha;

    /* Update x = x + alpha*p */
    if (l == 0 && *zeroguess)
    {
      N_VScale(alpha, p, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, alpha, p, x);
      SUNCheckLastErr();
    }

    /* Update r = r - alpha*Ap */
    N_VLinearSum(ONE, r, -alpha, Ap, r);
    SUNCheckLastErr();

    /* Set rho and check convergence */
    if (UseScaling)
    {
      N_VProd(r, w, Ap);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, r, Ap);
      SUNCheckLastErr();
    }
    rho = N_VDotProd(Ap, Ap);
    SUNCheckLastErr();
    *res_norm = rho = SUNRsqrt(rho);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                       "SUNLinSolSolve_PCG", "iterate-residual",
                       "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

    if (rho <= delta)
    {
      converged = SUNTRUE;
      break;
    }

    /* Exit early on last iteration */
    if (l == l_max - 1) { break; }

    /* Apply preconditioner:  z = P^{-1}*r */
    if (UsePrec)
    {
      status = psolve(P_data, r, z, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, r, z);
      SUNCheckLastErr();
    }

    /* update rz */
    rz_old = rz;
    rz     = N_VDotProd(r, z);
    SUNCheckLastErr();

    /* Calculate beta = <r,z> / <r_old,z_old> */
    beta = rz / rz_old;

    /* Update p = z + beta*p */
    N_VLinearSum(ONE, z, beta, p, p);
    SUNCheckLastErr();
  }

  /* Main loop finished, return with result */
  *zeroguess = SUNFALSE;
  if (converged == SUNTRUE) { LASTFLAG(S) = SUN_SUCCESS; }
  else if (rho < r0_norm) { LASTFLAG(S) = SUNLS_RES_REDUCED; }
  else { LASTFLAG(S) = SUNLS_CONV_FAIL; }
  return (LASTFLAG(S));
}